

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O3

void __thiscall
polyscope::render::ManagedBuffer<unsigned_int>::ensureHostBufferPopulated
          (ManagedBuffer<unsigned_int> *this)

{
  AttributeBuffer *buff;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  pointer puVar2;
  CanonicalDataSource CVar3;
  _Alloc_hider _Var4;
  string local_98;
  string local_78;
  string local_58;
  undefined1 local_38 [16];
  pointer local_28;
  
  CVar3 = currentCanonicalDataSource(this);
  if (CVar3 == RenderBuffer) {
    if (this->deviceBufferType - Texture1d < 3) {
      if ((this->renderTextureBuffer).
          super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"render buffer should be allocated but isn\'t","");
        exception(&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"copy-back from texture not implemented yet","");
      exception(&local_78);
      _Var4._M_p = local_78._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return;
      }
    }
    else {
      if ((this->renderAttributeBuffer).
          super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"render buffer should be allocated but isn\'t","");
        exception(&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
      }
      buff = (this->renderAttributeBuffer).
             super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
      getAttributeBufferDataRange<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,buff,0,
                 buff->dataSize);
      pvVar1 = this->data;
      puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_38._0_8_;
      (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_38._8_8_;
      local_38 = ZEXT816(0) << 0x20;
      (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_28;
      local_28 = (pointer)0x0;
      if (puVar2 == (pointer)0x0) {
        return;
      }
      operator_delete(puVar2);
      _Var4._M_p = (pointer)local_38._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        return;
      }
    }
    operator_delete(_Var4._M_p);
    return;
  }
  if (CVar3 != NeedsCompute) {
    return;
  }
  if ((this->computeFunc).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->computeFunc)._M_invoker)((_Any_data *)&this->computeFunc);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void ManagedBuffer<T>::ensureHostBufferPopulated() {

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    // good to go, nothing needs to be done
    break;

  case CanonicalDataSource::NeedsCompute:

    // compute it
    computeFunc();

    break;

  case CanonicalDataSource::RenderBuffer:

    if (deviceBufferTypeIsTexture()) {
      if (!renderTextureBuffer) exception("render buffer should be allocated but isn't");

      // copy the data back from the renderBuffer
      // TODO not implemented yet
      exception("copy-back from texture not implemented yet");
    } else {
      // sanity check
      if (!renderAttributeBuffer) exception("render buffer should be allocated but isn't");

      // copy the data back from the renderBuffer
      data = getAttributeBufferDataRange<T>(*renderAttributeBuffer, 0, renderAttributeBuffer->getDataSize());
    }

    break;
  };
}